

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

int kiss_fft_next_fast_size(int n)

{
  int m;
  int n_local;
  
  n_local = n;
  while( true ) {
    for (m = n_local; m % 2 == 0; m = m / 2) {
    }
    for (; m % 3 == 0; m = m / 3) {
    }
    for (; m % 5 == 0; m = m / 5) {
    }
    if (m < 2) break;
    n_local = n_local + 1;
  }
  return n_local;
}

Assistant:

int kiss_fft_next_fast_size(int n)
{
    while(1) {
        int m=n;
        while ( (m%2) == 0 ) m/=2;
        while ( (m%3) == 0 ) m/=3;
        while ( (m%5) == 0 ) m/=5;
        if (m<=1)
            break; /* n is completely factorable by twos, threes, and fives */
        n++;
    }
    return n;
}